

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locdspnm.cpp
# Opt level: O2

void __thiscall icu_63::LocaleDisplayNamesImpl::initialize(LocaleDisplayNamesImpl *this)

{
  ICUDataTable *this_00;
  Locale *this_01;
  bool bVar1;
  UBool UVar2;
  int32_t iVar3;
  UDisplayContext UVar4;
  Locale *pLVar5;
  BreakIterator *pBVar6;
  char16_t srcChar;
  bool bVar7;
  UErrorCode status;
  LocalUResourceBundlePointer resource;
  UnicodeString pattern;
  UnicodeString ktPattern;
  CapitalizationContextSink sink;
  UnicodeString sep;
  
  this_00 = &this->langData;
  this_01 = &(this->langData).locale;
  pLVar5 = Locale::getRoot();
  UVar2 = Locale::operator==(this_01,pLVar5);
  pLVar5 = &(this->regionData).locale;
  if (UVar2 == '\0') {
    pLVar5 = this_01;
  }
  Locale::operator=(&this->locale,pLVar5);
  sep.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003d8fe8;
  sep.fUnion.fStackFields.fLengthAndFlags = 2;
  ICUDataTable::getNoFallback(this_00,"localeDisplayPattern","separator",&sep);
  if ((sep.fUnion.fStackFields.fLengthAndFlags & 1U) != 0) {
    UnicodeString::UnicodeString(&pattern,"{0}, {1}",-1,kInvariant);
    UnicodeString::moveFrom(&sep,&pattern);
    UnicodeString::~UnicodeString(&pattern);
  }
  status = U_ZERO_ERROR;
  SimpleFormatter::applyPatternMinMaxArguments(&this->separatorFormat,&sep,2,2,&status);
  pattern.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003d8fe8;
  pattern.fUnion.fStackFields.fLengthAndFlags = 2;
  ICUDataTable::getNoFallback(this_00,"localeDisplayPattern","pattern",&pattern);
  if ((pattern.fUnion.fStackFields.fLengthAndFlags & 1U) != 0) {
    UnicodeString::UnicodeString(&ktPattern,"{0} ({1})",-1,kInvariant);
    UnicodeString::moveFrom(&pattern,&ktPattern);
    UnicodeString::~UnicodeString(&ktPattern);
  }
  SimpleFormatter::applyPatternMinMaxArguments(&this->format,&pattern,2,2,&status);
  iVar3 = UnicodeString::indexOf(&pattern,L'（');
  if (iVar3 < 0) {
    UnicodeString::setTo(&this->formatOpenParen,L'(');
    UnicodeString::setTo(&this->formatReplaceOpenParen,L'[');
    srcChar = L']';
    UnicodeString::setTo(&this->formatCloseParen,L')');
  }
  else {
    UnicodeString::setTo(&this->formatOpenParen,L'（');
    UnicodeString::setTo(&this->formatReplaceOpenParen,L'［');
    srcChar = L'］';
    UnicodeString::setTo(&this->formatCloseParen,L'）');
  }
  UnicodeString::setTo(&this->formatReplaceCloseParen,srcChar);
  ktPattern.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003d8fe8;
  ktPattern.fUnion.fStackFields.fLengthAndFlags = 2;
  ICUDataTable::get(this_00,"localeDisplayPattern","keyTypePattern",&ktPattern);
  if ((ktPattern.fUnion.fStackFields.fLengthAndFlags & 1U) != 0) {
    UnicodeString::UnicodeString((UnicodeString *)&sink,"{0}={1}",-1,kInvariant);
    UnicodeString::moveFrom(&ktPattern,(UnicodeString *)&sink);
    UnicodeString::~UnicodeString((UnicodeString *)&sink);
  }
  SimpleFormatter::applyPatternMinMaxArguments(&this->keyTypeFormat,&ktPattern,2,2,&status);
  this->fCapitalization[4] = '\0';
  this->fCapitalization[5] = '\0';
  this->fCapitalization[0] = '\0';
  this->fCapitalization[1] = '\0';
  this->fCapitalization[2] = '\0';
  this->fCapitalization[3] = '\0';
  UVar4 = this->capitalizationContext;
  if (UVar4 - UDISPCTX_CAPITALIZATION_FOR_UI_LIST_OR_MENU < 2) {
    resource.super_LocalPointerBase<UResourceBundle>.ptr =
         (LocalPointerBase<UResourceBundle>)
         ures_open_63((char *)0x0,(this->locale).fullName,&status);
    if (status < U_ILLEGAL_ARGUMENT_ERROR) {
      sink.super_ResourceSink.super_UObject._vptr_UObject =
           (UObject)&PTR__CapitalizationContextSink_003cd990;
      sink.hasCapitalizationUsage = '\0';
      sink.parent = this;
      ures_getAllItemsWithFallback_63
                ((UResourceBundle *)resource.super_LocalPointerBase<UResourceBundle>.ptr,
                 "contextTransforms",&sink.super_ResourceSink,&status);
      if (status == U_MISSING_RESOURCE_ERROR) {
        status = U_ZERO_ERROR;
LAB_0027df13:
        bVar7 = sink.hasCapitalizationUsage != '\0';
        bVar1 = true;
      }
      else {
        if (status < U_ILLEGAL_ARGUMENT_ERROR) goto LAB_0027df13;
        bVar7 = false;
        bVar1 = false;
      }
      ResourceSink::~ResourceSink(&sink.super_ResourceSink);
    }
    else {
      bVar7 = false;
      bVar1 = false;
    }
    LocalUResourceBundlePointer::~LocalUResourceBundlePointer(&resource);
    if (!bVar1) goto LAB_0027df84;
    UVar4 = this->capitalizationContext;
  }
  else {
    bVar7 = false;
  }
  if ((bVar7) || (UVar4 == UDISPCTX_CAPITALIZATION_FOR_BEGINNING_OF_SENTENCE)) {
    status = U_ZERO_ERROR;
    pBVar6 = BreakIterator::createSentenceInstance(&this->locale,&status);
    this->capitalizationBrkIter = pBVar6;
    if (U_ZERO_ERROR < status) {
      if (pBVar6 != (BreakIterator *)0x0) {
        (*(pBVar6->super_UObject)._vptr_UObject[1])(pBVar6);
      }
      this->capitalizationBrkIter = (BreakIterator *)0x0;
    }
  }
LAB_0027df84:
  UnicodeString::~UnicodeString(&ktPattern);
  UnicodeString::~UnicodeString(&pattern);
  UnicodeString::~UnicodeString(&sep);
  return;
}

Assistant:

void
LocaleDisplayNamesImpl::initialize(void) {
    LocaleDisplayNamesImpl *nonConstThis = (LocaleDisplayNamesImpl *)this;
    nonConstThis->locale = langData.getLocale() == Locale::getRoot()
        ? regionData.getLocale()
        : langData.getLocale();

    UnicodeString sep;
    langData.getNoFallback("localeDisplayPattern", "separator", sep);
    if (sep.isBogus()) {
        sep = UnicodeString("{0}, {1}", -1, US_INV);
    }
    UErrorCode status = U_ZERO_ERROR;
    separatorFormat.applyPatternMinMaxArguments(sep, 2, 2, status);

    UnicodeString pattern;
    langData.getNoFallback("localeDisplayPattern", "pattern", pattern);
    if (pattern.isBogus()) {
        pattern = UnicodeString("{0} ({1})", -1, US_INV);
    }
    format.applyPatternMinMaxArguments(pattern, 2, 2, status);
    if (pattern.indexOf((UChar)0xFF08) >= 0) {
        formatOpenParen.setTo((UChar)0xFF08);         // fullwidth (
        formatReplaceOpenParen.setTo((UChar)0xFF3B);  // fullwidth [
        formatCloseParen.setTo((UChar)0xFF09);        // fullwidth )
        formatReplaceCloseParen.setTo((UChar)0xFF3D); // fullwidth ]
    } else {
        formatOpenParen.setTo((UChar)0x0028);         // (
        formatReplaceOpenParen.setTo((UChar)0x005B);  // [
        formatCloseParen.setTo((UChar)0x0029);        // )
        formatReplaceCloseParen.setTo((UChar)0x005D); // ]
    }

    UnicodeString ktPattern;
    langData.get("localeDisplayPattern", "keyTypePattern", ktPattern);
    if (ktPattern.isBogus()) {
        ktPattern = UnicodeString("{0}={1}", -1, US_INV);
    }
    keyTypeFormat.applyPatternMinMaxArguments(ktPattern, 2, 2, status);

    uprv_memset(fCapitalization, 0, sizeof(fCapitalization));
#if !UCONFIG_NO_BREAK_ITERATION
    // Only get the context data if we need it! This is a const object so we know now...
    // Also check whether we will need a break iterator (depends on the data)
    UBool needBrkIter = FALSE;
    if (capitalizationContext == UDISPCTX_CAPITALIZATION_FOR_UI_LIST_OR_MENU || capitalizationContext == UDISPCTX_CAPITALIZATION_FOR_STANDALONE) {
        LocalUResourceBundlePointer resource(ures_open(NULL, locale.getName(), &status));
        if (U_FAILURE(status)) { return; }
        CapitalizationContextSink sink(*this);
        ures_getAllItemsWithFallback(resource.getAlias(), "contextTransforms", sink, status);
        if (status == U_MISSING_RESOURCE_ERROR) {
            // Silently ignore.  Not every locale has contextTransforms.
            status = U_ZERO_ERROR;
        } else if (U_FAILURE(status)) {
            return;
        }
        needBrkIter = sink.hasCapitalizationUsage;
    }
    // Get a sentence break iterator if we will need it
    if (needBrkIter || capitalizationContext == UDISPCTX_CAPITALIZATION_FOR_BEGINNING_OF_SENTENCE) {
        status = U_ZERO_ERROR;
        capitalizationBrkIter = BreakIterator::createSentenceInstance(locale, status);
        if (U_FAILURE(status)) {
            delete capitalizationBrkIter;
            capitalizationBrkIter = NULL;
        }
    }
#endif
}